

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O2

void mzapmsg(monst *mtmp,obj *otmp,boolean self)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ed2ca;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ed2c1;
      }
      else {
LAB_001ed2c1:
        if (ublindf == (obj *)0x0) goto LAB_001ed3e6;
LAB_001ed2ca:
        if (ublindf->oartifact != '\x1d') goto LAB_001ed3e6;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)
          ) || ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_001ed3e6;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_001ed3e6;
  }
  uVar1 = *(uint *)&mtmp->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar1 & 0x280) != 0) goto LAB_001ed3e6;
  }
  else if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_001ed3e6;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar6 = Monnam(mtmp);
    if (self == '\0') {
      pcVar5 = xname(otmp);
      pcVar5 = an(pcVar5);
      pline("%s zaps %s!",pcVar6,pcVar5);
      stop_occupation();
      return;
    }
    iVar3 = pronoun_gender(level,mtmp);
    pcVar5 = genders[iVar3].him;
    pcVar4 = doname(otmp);
    pline("%s zaps %sself with %s!",pcVar6,pcVar5,pcVar4);
    return;
  }
LAB_001ed3e6:
  if (flags.soundok == '\0') {
    return;
  }
  iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  pcVar6 = "distant";
  if (iVar3 < 0x52) {
    pcVar6 = "nearby";
  }
  You_hear("a %s zap.",pcVar6);
  return;
}

Assistant:

static void mzapmsg(struct monst *mtmp, struct obj *otmp, boolean self)
{
	if (!canseemon(level, mtmp)) {
		if (flags.soundok)
			You_hear("a %s zap.",
					(distu(mtmp->mx,mtmp->my) <= (BOLT_LIM+1)*(BOLT_LIM+1)) ?
					"nearby" : "distant");
	} else if (self)
		pline("%s zaps %sself with %s!",
		      Monnam(mtmp), mhim(level, mtmp), doname(otmp));
	else {
		pline("%s zaps %s!", Monnam(mtmp), an(xname(otmp)));
		stop_occupation();
	}
}